

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_future.c
# Opt level: O0

future_conflict future_create(future_impl impl,future_impl_interface_singleton singleton)

{
  int iVar1;
  future_interface pfVar2;
  code *in_RSI;
  future_impl in_RDI;
  future_conflict f;
  future local_8;
  
  local_8 = (future)malloc(0x10);
  if (local_8 == (future)0x0) {
    local_8 = (future)0x0;
  }
  else {
    local_8->impl = in_RDI;
    if (in_RSI == (code *)0x0) {
      local_8->interface = (future_interface)0x0;
    }
    else {
      pfVar2 = (future_interface)(*in_RSI)();
      local_8->interface = pfVar2;
    }
    if (((local_8->interface != (future_interface)0x0) &&
        (local_8->interface->create != (future_impl_interface_create)0x0)) &&
       (iVar1 = (*local_8->interface->create)(local_8,in_RDI), iVar1 != 0)) {
      log_write_impl_va("metacall",0x3a,"future_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_future.c"
                        ,LOG_LEVEL_ERROR,"Invalid future create callback <%p>",
                        local_8->interface->create);
      free(local_8);
      local_8 = (future)0x0;
    }
  }
  return local_8;
}

Assistant:

future future_create(future_impl impl, future_impl_interface_singleton singleton)
{
	future f = malloc(sizeof(struct future_type));

	if (f == NULL)
	{
		return NULL;
	}

	f->impl = impl;

	if (singleton)
	{
		f->interface = singleton();
	}
	else
	{
		f->interface = NULL;
	}

	if (f->interface != NULL && f->interface->create != NULL)
	{
		if (f->interface->create(f, impl) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid future create callback <%p>", f->interface->create);

			free(f);

			return NULL;
		}
	}

	return f;
}